

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

Vec2 __thiscall tcu::clampLodBounds(tcu *this,Vec2 *lodBounds,Vec2 *lodMinMax,LodPrecision *prec)

{
  float fVar1;
  float fVar2;
  Vec2 VVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float extraout_XMM0_Db;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar6 = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  fVar8 = fVar6 + lodMinMax->m_data[0];
  fVar7 = lodMinMax->m_data[0] - fVar6;
  fVar9 = lodMinMax->m_data[1] - fVar6;
  fVar1 = lodBounds->m_data[0];
  fVar2 = lodBounds->m_data[1];
  if (fVar1 <= fVar9) {
    fVar9 = fVar1;
  }
  uVar4 = -(uint)(fVar1 < fVar7);
  fVar6 = fVar6 + lodMinMax->m_data[1];
  if (fVar2 <= fVar6) {
    fVar6 = fVar2;
  }
  uVar5 = -(uint)(fVar2 < fVar8);
  *(uint *)this = ~uVar4 & (uint)fVar9 | (uint)fVar7 & uVar4;
  *(uint *)(this + 4) = ~uVar5 & (uint)fVar6 | (uint)fVar8 & uVar5;
  VVar3.m_data[1] = extraout_XMM0_Db;
  VVar3.m_data[0] = fVar6;
  return (Vec2)VVar3.m_data;
}

Assistant:

Vec2 clampLodBounds (const Vec2& lodBounds, const Vec2& lodMinMax, const LodPrecision& prec)
{
	const float lodErr	= computeFixedPointError(prec.lodBits);
	const float	a		= lodMinMax.x();
	const float	b		= lodMinMax.y();
	return Vec2(de::clamp(lodBounds.x(), a-lodErr, b-lodErr), de::clamp(lodBounds.y(), a+lodErr, b+lodErr));
}